

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall
mkvparser::Cues::Find(Cues *this,longlong time_ns,Track *pTrack,CuePoint **pCP,TrackPosition **pTP)

{
  CuePoint *pCVar1;
  undefined1 auVar2 [16];
  CuePoint *pCVar3;
  CuePoint *pCVar4;
  longlong lVar5;
  TrackPosition *pTVar6;
  size_t *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long *in_R8;
  longlong t;
  CuePoint *pCP_1;
  CuePoint **k;
  CuePoint **j;
  CuePoint **jj;
  CuePoint **i;
  CuePoint **ii;
  Segment *in_stack_ffffffffffffff98;
  Track *in_stack_ffffffffffffffa0;
  CuePoint *in_stack_ffffffffffffffa8;
  CuePoint *local_50;
  CuePoint *local_40;
  bool local_1;
  
  if ((((in_RSI < 0) || (in_RDX == 0)) || (*(long *)(in_RDI + 0x28) == 0)) ||
     (*(long *)(in_RDI + 0x30) == 0)) {
    local_1 = false;
  }
  else {
    pCVar1 = *(CuePoint **)(in_RDI + 0x28);
    pCVar4 = (CuePoint *)(&pCVar1->m_element_start + *(long *)(in_RDI + 0x30));
    *in_RCX = pCVar1->m_element_start;
    if (*in_RCX == 0) {
      local_1 = false;
    }
    else {
      lVar5 = CuePoint::GetTime((CuePoint *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      local_50 = pCVar4;
      local_40 = pCVar1;
      if (lVar5 < in_RSI) {
        do {
          if (local_50 <= local_40) {
            if (((local_40 == local_50) && (local_40 <= pCVar4)) && (pCVar1 < local_40)) {
              *in_RCX = local_40[-1].m_track_positions_count;
              if ((*in_RCX != 0) &&
                 (lVar5 = CuePoint::GetTime((CuePoint *)in_stack_ffffffffffffffa0,
                                            in_stack_ffffffffffffff98), lVar5 <= in_RSI)) {
                pTVar6 = CuePoint::Find(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
                *in_R8 = (long)pTVar6;
                return *in_R8 != 0;
              }
              return false;
            }
            return false;
          }
          auVar2._8_8_ = (long)local_50 - (long)local_40 >> 0x3f;
          auVar2._0_8_ = (long)local_50 - (long)local_40 >> 3;
          in_stack_ffffffffffffffa8 =
               (CuePoint *)(&local_40->m_element_start + SUB168(auVar2 / SEXT816(2),0));
          if (pCVar4 <= in_stack_ffffffffffffffa8) {
            return false;
          }
          in_stack_ffffffffffffffa0 = (Track *)in_stack_ffffffffffffffa8->m_element_start;
          if (in_stack_ffffffffffffffa0 == (Track *)0x0) {
            return false;
          }
          in_stack_ffffffffffffff98 =
               (Segment *)
               CuePoint::GetTime((CuePoint *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          pCVar3 = in_stack_ffffffffffffffa8;
          if ((long)in_stack_ffffffffffffff98 <= in_RSI) {
            local_40 = (CuePoint *)&in_stack_ffffffffffffffa8->m_element_size;
            pCVar3 = local_50;
          }
          local_50 = pCVar3;
        } while (local_40 <= local_50);
        local_1 = false;
      }
      else {
        pTVar6 = CuePoint::Find(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        *in_R8 = (long)pTVar6;
        local_1 = *in_R8 != 0;
      }
    }
  }
  return local_1;
}

Assistant:

bool Cues::Find(long long time_ns, const Track* pTrack, const CuePoint*& pCP,
                const CuePoint::TrackPosition*& pTP) const {
  if (time_ns < 0 || pTrack == NULL || m_cue_points == NULL || m_count == 0)
    return false;

  CuePoint** const ii = m_cue_points;
  CuePoint** i = ii;

  CuePoint** const jj = ii + m_count;
  CuePoint** j = jj;

  pCP = *i;
  if (pCP == NULL)
    return false;

  if (time_ns <= pCP->GetTime(m_pSegment)) {
    pTP = pCP->Find(pTrack);
    return (pTP != NULL);
  }

  while (i < j) {
    // INVARIANT:
    //[ii, i) <= time_ns
    //[i, j)  ?
    //[j, jj) > time_ns

    CuePoint** const k = i + (j - i) / 2;
    if (k >= jj)
      return false;

    CuePoint* const pCP = *k;
    if (pCP == NULL)
      return false;

    const long long t = pCP->GetTime(m_pSegment);

    if (t <= time_ns)
      i = k + 1;
    else
      j = k;

    if (i > j)
      return false;
  }

  if (i != j || i > jj || i <= ii)
    return false;

  pCP = *--i;

  if (pCP == NULL || pCP->GetTime(m_pSegment) > time_ns)
    return false;

  // TODO: here and elsewhere, it's probably not correct to search
  // for the cue point with this time, and then search for a matching
  // track.  In principle, the matching track could be on some earlier
  // cue point, and with our current algorithm, we'd miss it.  To make
  // this bullet-proof, we'd need to create a secondary structure,
  // with a list of cue points that apply to a track, and then search
  // that track-based structure for a matching cue point.

  pTP = pCP->Find(pTrack);
  return (pTP != NULL);
}